

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_GetIterator2(JSContext *ctx,JSValue obj,JSValue method)

{
  int iVar1;
  uint uVar2;
  JSRefCountHeader *p;
  JSValue JVar3;
  uint uStack_1c;
  
  JVar3.tag = 3;
  JVar3.u.ptr = (void *)((ulong)uStack_1c << 0x20);
  JVar3 = JS_CallInternal(ctx,method,obj,JVar3,0,(JSValue *)0x0,2);
  uVar2 = (uint)JVar3.tag;
  if ((uVar2 != 0xffffffff) && (uVar2 != 6)) {
    if ((0xfffffff4 < uVar2) && (iVar1 = *JVar3.u.ptr, *(int *)JVar3.u.ptr = iVar1 + -1, iVar1 < 2))
    {
      __JS_FreeValueRT(ctx->rt,JVar3);
    }
    JS_ThrowTypeError(ctx,"not an object");
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar3;
}

Assistant:

static JSValue JS_GetIterator2(JSContext *ctx, JSValueConst obj,
                               JSValueConst method)
{
    JSValue enum_obj;

    enum_obj = JS_Call(ctx, method, obj, 0, NULL);
    if (JS_IsException(enum_obj))
        return enum_obj;
    if (!JS_IsObject(enum_obj)) {
        JS_FreeValue(ctx, enum_obj);
        return JS_ThrowTypeErrorNotAnObject(ctx);
    }
    return enum_obj;
}